

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

ostream * tchecker::operator<<(ostream *os,clock_constraint_t *c)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  bVar3 = c->_cmp != LT;
  pcVar2 = "<=";
  if (!bVar3) {
    pcVar2 = "<";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3 + 1);
  std::ostream::operator<<((ostream *)poVar1,c->_value);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::clock_constraint_t const & c)
{
  os << c._id1 << "-" << c._id2 << (c._cmp == tchecker::LT ? "<" : "<=") << c._value;
  return os;
}